

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Node * __thiscall JSON::Parser::parse(Parser *this)

{
  Token *this_00;
  initializer_list<JSON::Node> __l;
  allocator_type local_199;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_198;
  string local_180;
  undefined1 *local_160;
  size_type local_158;
  undefined1 local_150 [16];
  Node body;
  Node node;
  Node local_80;
  
  std::__cxx11::string::string((string *)&local_160,"",(allocator *)&node);
  body.type._M_dataplus._M_p._0_4_ = 0x30;
  body.type._M_string_length = (long)&body.type.field_2 + 8;
  if (local_160 == local_150) {
    body.start = local_150._8_4_;
    body.end = local_150._12_4_;
  }
  else {
    body.type._M_string_length = (size_type)local_160;
  }
  body.type.field_2._M_allocated_capacity = local_158;
  local_158 = 0;
  local_150[0] = 0;
  body.rawValue._M_dataplus._M_p = (pointer)0x0;
  this_00 = &this->currentToken;
  local_160 = local_150;
  Token::operator=(this_00,(Token *)&body);
  std::__cxx11::string::~string((string *)&body.type._M_string_length);
  std::__cxx11::string::~string((string *)&local_160);
  Token::operator=(&this->lastToken,this_00);
  this->pos = 0;
  next(this);
  parseNode(&body,this);
  std::__cxx11::string::string((string *)&local_180,(string *)NodeType::Root_abi_cxx11_);
  Node::Node(&local_80,&body);
  __l._M_len = 1;
  __l._M_array = &local_80;
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector(&local_198,__l,&local_199);
  Node::Node(&node,&local_180,&local_198,0,this->length);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_198);
  Node::~Node(&local_80);
  std::__cxx11::string::~string((string *)&local_180);
  Node::operator=(&this->ast,&node);
  if (this_00->type == END_F) {
    Node::~Node(&node);
    Node::~Node(&body);
    return &this->ast;
  }
  unexpected(this,this_00);
}

Assistant:

Node &Parser::parse() {
        currentToken = Token(START_F, "", 0, 0);
        lastToken = currentToken;
        pos = 0;

        next();
        Node body = parseNode();
        Node node(NodeType::Root, vector<Node>{body}, 0, length);
        ast = node;
        if (currentToken.type != END_F) {
            unexpected(currentToken);
        }
        return ast;
    }